

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Writer.cpp
# Opt level: O2

void __thiscall adios2::core::engine::BP3Writer::WriteProfilingJSONFile(BP3Writer *this)

{
  TransportMan *this_00;
  undefined1 *this_01;
  BP3Serializer *this_02;
  int iVar1;
  size_t i;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_461;
  ScopedTimer __var2284;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bpBaseNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transportTypes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bpMetadataFileNames;
  vector<char,_std::allocator<char>_> profilingJSON;
  vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
  transportProfilersMD;
  vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
  transportProfilers;
  string profileFileName;
  string lineJSON;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transportTypesMD;
  FileFStream profilingJSONStream;
  
  if (WriteProfilingJSONFile()::__var284 == '\0') {
    iVar1 = __cxa_guard_acquire(&WriteProfilingJSONFile()::__var284);
    if (iVar1 != 0) {
      WriteProfilingJSONFile::__var284 =
           (void *)ps_timer_create_("BP3Writer::WriteProfilingJSONFile");
      __cxa_guard_release(&WriteProfilingJSONFile()::__var284);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            (&__var2284,WriteProfilingJSONFile::__var284);
  transportman::TransportMan::GetTransportsTypes_abi_cxx11_
            (&transportTypes,&this->m_FileDataManager);
  uVar3 = 0xffffffffffffffff;
  lVar4 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)transportTypes.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)transportTypes.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar2 = uVar2 + 1) {
    iVar1 = std::__cxx11::string::compare
                      ((long)&((transportTypes.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar4,0,(char *)0x4);
    if (iVar1 == 0) {
      uVar3 = uVar2;
    }
    uVar3 = uVar3 & 0xffffffff;
    lVar4 = lVar4 + 0x20;
  }
  transportman::TransportMan::GetTransportsProfilers(&transportProfilers,&this->m_FileDataManager);
  this_00 = &this->m_FileMetadataManager;
  transportman::TransportMan::GetTransportsTypes_abi_cxx11_(&transportTypesMD,this_00);
  transportman::TransportMan::GetTransportsProfilers(&transportProfilersMD,this_00);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&transportTypes,
             (const_iterator)
             transportTypes.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )transportTypesMD.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )transportTypesMD.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  std::vector<adios2::profiling::IOChrono*,std::allocator<adios2::profiling::IOChrono*>>::
  insert<__gnu_cxx::__normal_iterator<adios2::profiling::IOChrono**,std::vector<adios2::profiling::IOChrono*,std::allocator<adios2::profiling::IOChrono*>>>,void>
            ((vector<adios2::profiling::IOChrono*,std::allocator<adios2::profiling::IOChrono*>> *)
             &transportProfilers,
             (const_iterator)
             transportProfilers.
             super__Vector_base<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<adios2::profiling::IOChrono_**,_std::vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>_>
              )transportProfilersMD.
               super__Vector_base<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<adios2::profiling::IOChrono_**,_std::vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>_>
              )transportProfilersMD.
               super__Vector_base<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  this_01 = &(this->m_BP3Serializer).super_BP3Base.field_0x8;
  adios2::format::BPSerializer::GetRankProfilingJSON
            ((string *)&profilingJSONStream,(BPSerializer *)this_01,&transportTypes,
             &transportProfilers);
  std::operator+(&lineJSON,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &profilingJSONStream,",\n");
  std::__cxx11::string::~string((string *)&profilingJSONStream);
  adios2::format::BPSerializer::AggregateProfilingJSON
            (&profilingJSON,(BPSerializer *)this_01,&lineJSON);
  this_02 = &this->m_BP3Serializer;
  if (*(int *)((this_02->super_BP3Base)._vptr_BP3Base[-3] + 0x10 +
              (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base) == 0) {
    transport::FileFStream::FileFStream(&profilingJSONStream,&(this->super_Engine).m_Comm);
    profileFileName._M_dataplus._M_p = (pointer)&profileFileName.field_2;
    profileFileName._M_string_length = 0;
    profileFileName.field_2._M_local_buf[0] = '\0';
    if ((int)uVar3 < 0) {
      transportman::TransportMan::GetFilesBaseNames
                (&bpBaseNames,this_00,&(this->super_Engine).m_Name,
                 &((this->super_Engine).m_IO)->m_TransportsParameters);
      adios2::format::BP3Base::GetBPMetadataFileNames
                (&bpMetadataFileNames,&this_02->super_BP3Base,&bpBaseNames);
      std::operator+(&local_420,
                     bpMetadataFileNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,"_profiling.json");
      std::__cxx11::string::operator=((string *)&profileFileName,(string *)&local_420);
      std::__cxx11::string::~string((string *)&local_420);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&bpMetadataFileNames);
    }
    else {
      std::__cxx11::string::string((string *)&local_420,(string *)&(this->super_Engine).m_Name);
      __l._M_len = 1;
      __l._M_array = &local_420;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&bpMetadataFileNames,__l,&local_461);
      adios2::format::BP3Base::GetBPBaseNames
                (&bpBaseNames,&this_02->super_BP3Base,&bpMetadataFileNames);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&bpMetadataFileNames);
      std::__cxx11::string::~string((string *)&local_420);
      std::operator+(&local_420,
                     bpBaseNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (uVar3 & 0xffffffff),
                     "/profiling.json");
      std::__cxx11::string::operator=((string *)&profileFileName,(string *)&local_420);
      std::__cxx11::string::~string((string *)&local_420);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&bpBaseNames);
    transport::FileFStream::Open(&profilingJSONStream,&profileFileName,Write,false,false);
    transport::FileFStream::Write
              (&profilingJSONStream,
               profilingJSON.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)profilingJSON.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)profilingJSON.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,0xffffffffffffffff);
    transport::FileFStream::Close(&profilingJSONStream);
    std::__cxx11::string::~string((string *)&profileFileName);
    transport::FileFStream::~FileFStream(&profilingJSONStream);
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&profilingJSON.super__Vector_base<char,_std::allocator<char>_>);
  std::__cxx11::string::~string((string *)&lineJSON);
  std::_Vector_base<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>::
  ~_Vector_base(&transportProfilersMD.
                 super__Vector_base<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
               );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&transportTypesMD);
  std::_Vector_base<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>::
  ~_Vector_base(&transportProfilers.
                 super__Vector_base<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
               );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&transportTypes);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var2284);
  return;
}

Assistant:

void BP3Writer::WriteProfilingJSONFile()
{
    PERFSTUBS_SCOPED_TIMER("BP3Writer::WriteProfilingJSONFile");
    auto transportTypes = m_FileDataManager.GetTransportsTypes();

    // find first File type output, where we can write the profile
    int fileTransportIdx = -1;
    for (size_t i = 0; i < transportTypes.size(); ++i)
    {
        if (transportTypes[i].compare(0, 4, "File") == 0)
        {
            fileTransportIdx = static_cast<int>(i);
        }
    }

    auto transportProfilers = m_FileDataManager.GetTransportsProfilers();

    auto transportTypesMD = m_FileMetadataManager.GetTransportsTypes();
    auto transportProfilersMD = m_FileMetadataManager.GetTransportsProfilers();

    transportTypes.insert(transportTypes.end(), transportTypesMD.begin(), transportTypesMD.end());

    transportProfilers.insert(transportProfilers.end(), transportProfilersMD.begin(),
                              transportProfilersMD.end());

    const std::string lineJSON(
        m_BP3Serializer.GetRankProfilingJSON(transportTypes, transportProfilers) + ",\n");

    const std::vector<char> profilingJSON(m_BP3Serializer.AggregateProfilingJSON(lineJSON));

    if (m_BP3Serializer.m_RankMPI == 0)
    {
        transport::FileFStream profilingJSONStream(m_Comm);
        std::string profileFileName;
        if (fileTransportIdx > -1)
        {
            // write profile to <filename.bp>.dir/profiling.json
            auto bpBaseNames = m_BP3Serializer.GetBPBaseNames({m_Name});
            profileFileName = bpBaseNames[fileTransportIdx] + "/profiling.json";
        }
        else
        {
            // write profile to <filename.bp>_profiling.json
            auto transportsNames =
                m_FileMetadataManager.GetFilesBaseNames(m_Name, m_IO.m_TransportsParameters);

            auto bpMetadataFileNames = m_BP3Serializer.GetBPMetadataFileNames(transportsNames);
            profileFileName = bpMetadataFileNames[0] + "_profiling.json";
        }
        profilingJSONStream.Open(profileFileName, Mode::Write);
        profilingJSONStream.Write(profilingJSON.data(), profilingJSON.size());
        profilingJSONStream.Close();
    }
}